

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_toint(lua_State *L)

{
  undefined8 in_RAX;
  lua_Integer n;
  int valid;
  
  valid = (int)((ulong)in_RAX >> 0x20);
  n = lua_tointegerx(L,1,&valid);
  if (valid == 0) {
    luaL_checkany(L,1);
    lua_pushnil(L);
  }
  else {
    lua_pushinteger(L,n);
  }
  return 1;
}

Assistant:

static int math_toint(lua_State *L) {
    int valid;
    lua_Integer n = lua_tointegerx(L, 1, &valid);
    if (valid)
        lua_pushinteger(L, n);
    else {
        luaL_checkany(L, 1);
        lua_pushnil(L);  /* value is not convertible to integer */
    }
    return 1;
}